

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  ImGuiContextHook *pIVar1;
  ImGuiWindow *window;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ImGuiContext *g;
  bool bVar10;
  ulong uVar11;
  ImDrawList **ppIVar12;
  long lVar13;
  ImGuiWindow *pIVar14;
  long lVar15;
  ImGuiWindow *pIVar16;
  
  pIVar3 = GImGui;
  iVar6 = GImGui->FrameCountEnded;
  if (iVar6 != GImGui->FrameCount) {
    EndFrame();
    iVar6 = pIVar3->FrameCount;
  }
  pIVar3->FrameCountRendered = iVar6;
  (pIVar3->IO).MetricsRenderWindows = 0;
  out_list = &pIVar3->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  iVar6 = (pIVar3->Hooks).Size;
  if (0 < iVar6) {
    lVar15 = 0;
    lVar13 = 0;
    do {
      pIVar1 = (pIVar3->Hooks).Data;
      if (*(int *)(pIVar1 + lVar15) == 4) {
        (**(code **)(pIVar1 + lVar15 + 8))(pIVar3);
        iVar6 = (pIVar3->Hooks).Size;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x18;
    } while (lVar13 < iVar6);
  }
  if ((pIVar3->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar3->BackgroundDrawList);
  }
  pIVar16 = pIVar3->NavWindowingTarget;
  if (pIVar16 == (ImGuiWindow *)0x0) {
    pIVar16 = (ImGuiWindow *)0x0;
    pIVar14 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar16->Flags & 0x2000) == 0) {
      pIVar16 = pIVar16->RootWindow;
    }
    else {
      pIVar16 = (ImGuiWindow *)0x0;
    }
    pIVar14 = pIVar3->NavWindowingListWindow;
  }
  uVar7 = (pIVar3->Windows).Size;
  if (uVar7 != 0) {
    uVar11 = 0;
    do {
      window = (pIVar3->Windows).Data[uVar11];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar14 && window != pIVar16) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData((ImVector<ImDrawList_*> *)
                            ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                            (ulong)((uint)window->Flags >> 0x15 & 0x10)),window);
        uVar7 = (pIVar3->Windows).Size;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  bVar5 = true;
  do {
    bVar10 = bVar5;
    if (((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->Active == true)) && (pIVar16->Hidden == false)
       ) {
      AddWindowToDrawData((ImVector<ImDrawList_*> *)
                          ((long)&(GImGui->DrawDataBuilder).Layers[0].Size +
                          (ulong)((uint)pIVar16->Flags >> 0x15 & 0x10)),pIVar16);
    }
    pIVar16 = pIVar14;
    bVar5 = false;
  } while (bVar10);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar3->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar3->ForegroundDrawList,(pIVar3->IO).MousePos,
                      (pIVar3->Style).MouseCursorScale,pIVar3->MouseCursor,0xffffffff,0xff000000,
                      0x30000000);
  }
  if ((pIVar3->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar3->ForegroundDrawList);
  }
  pIVar4 = GImGui;
  (pIVar3->DrawData).Valid = true;
  iVar6 = (pIVar3->DrawDataBuilder).Layers[0].Size;
  iVar8 = 0;
  if ((long)iVar6 < 1) {
    ppIVar12 = (ImDrawList **)0x0;
  }
  else {
    ppIVar12 = (pIVar3->DrawDataBuilder).Layers[0].Data;
  }
  (pIVar3->DrawData).CmdLists = ppIVar12;
  (pIVar3->DrawData).CmdListsCount = iVar6;
  (pIVar3->DrawData).TotalIdxCount = 0;
  (pIVar3->DrawData).TotalVtxCount = 0;
  (pIVar3->DrawData).DisplayPos.x = 0.0;
  (pIVar3->DrawData).DisplayPos.y = 0.0;
  (pIVar3->DrawData).DisplaySize = (pIVar4->IO).DisplaySize;
  (pIVar3->DrawData).FramebufferScale = (pIVar4->IO).DisplayFramebufferScale;
  iVar9 = 0;
  if (0 < iVar6) {
    lVar13 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      pIVar2 = (pIVar3->DrawDataBuilder).Layers[0].Data[lVar13];
      iVar9 = iVar9 + (pIVar2->VtxBuffer).Size;
      iVar8 = iVar8 + (pIVar2->IdxBuffer).Size;
      lVar13 = lVar13 + 1;
    } while (iVar6 != lVar13);
    (pIVar3->DrawData).TotalVtxCount = iVar9;
    (pIVar3->DrawData).TotalIdxCount = iVar8;
  }
  (pIVar3->IO).MetricsRenderVertices = iVar9;
  (pIVar3->IO).MetricsRenderIndices = iVar8;
  iVar6 = (pIVar3->Hooks).Size;
  if (0 < iVar6) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      pIVar1 = (pIVar3->Hooks).Data;
      if (*(int *)(pIVar1 + lVar13) == 5) {
        (**(code **)(pIVar1 + lVar13 + 8))(pIVar3,pIVar1 + lVar13);
        iVar6 = (pIVar3->Hooks).Size;
      }
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar15 < iVar6);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}